

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_svm.cc
# Opt level: O0

void __thiscall svm_example::~svm_example(svm_example *this)

{
  flat_example *__dest;
  long in_RDI;
  flat_example *fec;
  v_array<float> *in_stack_ffffffffffffffe0;
  
  v_array<float>::delete_v(in_stack_ffffffffffffffe0);
  __dest = calloc_or_throw<flat_example>();
  memcpy(__dest,(void *)(in_RDI + 0x20),200);
  free_flatten_example((flat_example *)0x2c85c2);
  return;
}

Assistant:

svm_example::~svm_example()
{
  krow.delete_v();
  // free flatten example contents
  flat_example* fec = &calloc_or_throw<flat_example>();
  *fec = ex;
  free_flatten_example(fec);  // free contents of flat example and frees fec.
}